

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O1

bool __thiscall Clasp::ProgramBuilder::parseProgram(ProgramBuilder *this,istream *input)

{
  bool bVar1;
  int iVar2;
  ulong in_RAX;
  ProgramParser *this_00;
  socklen_t *in_RCX;
  
  if ((this->ctx_ != (SharedContext *)0x0) && (this->frozen_ != true)) {
    this_00 = parser(this);
    in_RAX = in_RAX & 0xffffffffffffff;
    iVar2 = ProgramParser::accept(this_00,(int)input,(sockaddr *)&stack0xffffffffffffffef,in_RCX);
    if ((char)iVar2 != '\0') {
      bVar1 = ProgramParser::parse(this_00);
      return bVar1;
    }
    Potassco::fail(-2,"bool Clasp::ProgramBuilder::parseProgram(std::istream &)",0x51,
                   "p.accept(input)","unrecognized input format",0,in_RAX);
  }
  Potassco::fail(-2,"bool Clasp::ProgramBuilder::parseProgram(std::istream &)",0x4f,
                 "ctx_ && !frozen()",(char *)0x0);
}

Assistant:

bool ProgramBuilder::parseProgram(std::istream& input) {
	POTASSCO_REQUIRE(ctx_ && !frozen());
	ProgramParser& p = parser();
	POTASSCO_REQUIRE(p.accept(input), "unrecognized input format");
	return p.parse();
}